

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O1

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer ptVar1;
  int iVar2;
  undefined8 uVar3;
  thread *thread;
  pointer ptVar4;
  
  if ((this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->jobListMutex);
    if (iVar2 != 0) {
      uVar3 = std::__throw_system_error(iVar2);
      __clang_call_terminate(uVar3);
    }
    this->shutdownThreads = true;
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->jobListMutex);
    ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ptVar4 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads);
  std::condition_variable::~condition_variable(&this->jobListCondition);
  return;
}

Assistant:

ThreadPool::~ThreadPool() {
    if (threads.empty())
        return;

    {
        std::lock_guard<std::mutex> lock(jobListMutex);
        shutdownThreads = true;
        jobListCondition.notify_all();
    }

    for (std::thread &thread : threads)
        thread.join();
}